

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * arrayClosure(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *extraout_RAX;
  double __x;
  allocator local_b9;
  treeNode *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,"{",&local_b9);
  bVar1 = match(&local_70,Empty);
  __x = (double)std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    ptVar2 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_90,"sequence",&local_b9);
    treeNode::treeNode(ptVar2,declareStmt,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ptVar3 = arrayClosure();
    ptVar2->child[0] = ptVar3;
    local_b8 = ptVar2;
    while( true ) {
      std::__cxx11::string::string((string *)&local_50,",",&local_b9);
      bVar1 = match(&local_50,Empty);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) break;
      ptVar2 = arrayClosure();
      ptVar3->sibling = ptVar2;
      ptVar3 = ptVar2;
    }
    std::__cxx11::string::string((string *)&local_b0,"}",&local_b9);
    match(&local_b0,lackRightBucket);
    ptVar3 = local_b8;
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    exp(__x);
    ptVar3 = extraout_RAX;
  }
  return ptVar3;
}

Assistant:

treeNode* arrayClosure()
{
    if(match("{"))
    {
        auto ret = new treeNode(StmtKind::declareStmt,"sequence");
        ret->child[0]=arrayClosure();
        auto p=ret->child[0];
        while(match(","))
        {
            p->sibling=arrayClosure();
            p=p->sibling;
        }
        match("}",Error::lackRightBucket);
        return ret;
    }
    else
    {
        return exp();
    }
}